

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_misc.c
# Opt level: O1

int lj_cf_misc_getmetrics(lua_State *L)

{
  GCstr *pGVar1;
  TValue *pTVar2;
  GCtab *t;
  luam_Metrics metrics;
  luam_Metrics local_b0;
  
  lua_createtable(L,0,0x13);
  t = (GCtab *)(ulong)L->top[-1].u32.lo;
  luaM_metrics(L,&local_b0);
  pGVar1 = lj_str_new(L,"strhash_hit",0xb);
  pTVar2 = lj_tab_setstr(L,t,pGVar1);
  pTVar2->n = (double)(long)local_b0.strhash_hit;
  pGVar1 = lj_str_new(L,"strhash_miss",0xc);
  pTVar2 = lj_tab_setstr(L,t,pGVar1);
  pTVar2->n = (double)(long)local_b0.strhash_miss;
  pGVar1 = lj_str_new(L,"gc_strnum",9);
  pTVar2 = lj_tab_setstr(L,t,pGVar1);
  pTVar2->n = (double)(long)local_b0.gc_strnum;
  pGVar1 = lj_str_new(L,"gc_tabnum",9);
  pTVar2 = lj_tab_setstr(L,t,pGVar1);
  pTVar2->n = (double)(long)local_b0.gc_tabnum;
  pGVar1 = lj_str_new(L,"gc_udatanum",0xb);
  pTVar2 = lj_tab_setstr(L,t,pGVar1);
  pTVar2->n = (double)(long)local_b0.gc_udatanum;
  pGVar1 = lj_str_new(L,"gc_cdatanum",0xb);
  pTVar2 = lj_tab_setstr(L,t,pGVar1);
  pTVar2->n = (double)(long)local_b0.gc_cdatanum;
  pGVar1 = lj_str_new(L,"gc_total",8);
  pTVar2 = lj_tab_setstr(L,t,pGVar1);
  pTVar2->n = (double)(long)local_b0.gc_total;
  pGVar1 = lj_str_new(L,"gc_freed",8);
  pTVar2 = lj_tab_setstr(L,t,pGVar1);
  pTVar2->n = (double)(long)local_b0.gc_freed;
  pGVar1 = lj_str_new(L,"gc_allocated",0xc);
  pTVar2 = lj_tab_setstr(L,t,pGVar1);
  pTVar2->n = (double)(long)local_b0.gc_allocated;
  pGVar1 = lj_str_new(L,"gc_steps_pause",0xe);
  pTVar2 = lj_tab_setstr(L,t,pGVar1);
  pTVar2->n = (double)(long)local_b0.gc_steps_pause;
  pGVar1 = lj_str_new(L,"gc_steps_propagate",0x12);
  pTVar2 = lj_tab_setstr(L,t,pGVar1);
  pTVar2->n = (double)(long)local_b0.gc_steps_propagate;
  pGVar1 = lj_str_new(L,"gc_steps_atomic",0xf);
  pTVar2 = lj_tab_setstr(L,t,pGVar1);
  pTVar2->n = (double)(long)local_b0.gc_steps_atomic;
  pGVar1 = lj_str_new(L,"gc_steps_sweepstring",0x14);
  pTVar2 = lj_tab_setstr(L,t,pGVar1);
  pTVar2->n = (double)(long)local_b0.gc_steps_sweepstring;
  pGVar1 = lj_str_new(L,"gc_steps_sweep",0xe);
  pTVar2 = lj_tab_setstr(L,t,pGVar1);
  pTVar2->n = (double)(long)local_b0.gc_steps_sweep;
  pGVar1 = lj_str_new(L,"gc_steps_finalize",0x11);
  pTVar2 = lj_tab_setstr(L,t,pGVar1);
  pTVar2->n = (double)(long)local_b0.gc_steps_finalize;
  pGVar1 = lj_str_new(L,"jit_snap_restore",0x10);
  pTVar2 = lj_tab_setstr(L,t,pGVar1);
  pTVar2->n = (double)(long)local_b0.jit_snap_restore;
  pGVar1 = lj_str_new(L,"jit_trace_abort",0xf);
  pTVar2 = lj_tab_setstr(L,t,pGVar1);
  pTVar2->n = (double)(long)local_b0.jit_trace_abort;
  pGVar1 = lj_str_new(L,"jit_mcode_size",0xe);
  pTVar2 = lj_tab_setstr(L,t,pGVar1);
  pTVar2->n = (double)(long)local_b0.jit_mcode_size;
  pGVar1 = lj_str_new(L,"jit_trace_num",0xd);
  pTVar2 = lj_tab_setstr(L,t,pGVar1);
  pTVar2->n = (double)local_b0.jit_trace_num;
  return 1;
}

Assistant:

LJLIB_CF(misc_getmetrics)
{
  struct luam_Metrics metrics;
  GCtab *m;

  lua_createtable(L, 0, 19);
  m = tabV(L->top - 1);

  luaM_metrics(L, &metrics);

  setnumfield(L, m, "strhash_hit", metrics.strhash_hit);
  setnumfield(L, m, "strhash_miss", metrics.strhash_miss);

  setnumfield(L, m, "gc_strnum", metrics.gc_strnum);
  setnumfield(L, m, "gc_tabnum", metrics.gc_tabnum);
  setnumfield(L, m, "gc_udatanum", metrics.gc_udatanum);
  setnumfield(L, m, "gc_cdatanum", metrics.gc_cdatanum);

  setnumfield(L, m, "gc_total", metrics.gc_total);
  setnumfield(L, m, "gc_freed", metrics.gc_freed);
  setnumfield(L, m, "gc_allocated", metrics.gc_allocated);

  setnumfield(L, m, "gc_steps_pause", metrics.gc_steps_pause);
  setnumfield(L, m, "gc_steps_propagate", metrics.gc_steps_propagate);
  setnumfield(L, m, "gc_steps_atomic", metrics.gc_steps_atomic);
  setnumfield(L, m, "gc_steps_sweepstring", metrics.gc_steps_sweepstring);
  setnumfield(L, m, "gc_steps_sweep", metrics.gc_steps_sweep);
  setnumfield(L, m, "gc_steps_finalize", metrics.gc_steps_finalize);

  setnumfield(L, m, "jit_snap_restore", metrics.jit_snap_restore);
  setnumfield(L, m, "jit_trace_abort", metrics.jit_trace_abort);
  setnumfield(L, m, "jit_mcode_size", metrics.jit_mcode_size);
  setnumfield(L, m, "jit_trace_num", metrics.jit_trace_num);

  return 1;
}